

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_transporter.cpp
# Opt level: O2

void __thiscall
SocketServerTransporter::OnNewConnection
          (SocketServerTransporter *this,uv_stream_t *server,int status)

{
  uint __line;
  int iVar1;
  uv_tcp_t *tcp;
  
  tcp = (uv_tcp_t *)malloc(0xf8);
  this->uvClient = (uv_stream_t *)tcp;
  tcp->data = this;
  iVar1 = uv_tcp_init((this->super_Transporter).loop,tcp);
  if (iVar1 == 0) {
    iVar1 = uv_accept(server,this->uvClient);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(this->uvClient,echo_alloc,after_read);
      if (iVar1 == 0) {
        (*(this->super_Transporter)._vptr_Transporter[5])(this,1);
        return;
      }
      __line = 0x61;
    }
    else {
      __line = 0x5e;
    }
  }
  else {
    __line = 0x5b;
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/transporter/socket_server_transporter.cpp"
                ,__line,"void SocketServerTransporter::OnNewConnection(uv_stream_t *, int)");
}

Assistant:

void SocketServerTransporter::OnNewConnection(uv_stream_t* server, int status) {
	// todo: free prev client
	uvClient = static_cast<uv_stream_t*>(malloc(sizeof(uv_tcp_t)));
	uvClient->data = this;

	int r = uv_tcp_init(loop, reinterpret_cast<uv_tcp_t*>(uvClient));
	assert(r == 0);

	r = uv_accept(server, uvClient);
	assert(r == 0);

	r = uv_read_start(uvClient, echo_alloc, after_read);
	assert(r == 0);

	OnConnect(true);
}